

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gamefield.c
# Opt level: O1

void InitGamefield(Gamefield *gamefield)

{
  uint8_t *puVar1;
  Pixel *pPVar2;
  long lVar3;
  ulong uVar4;
  Pixel pixel;
  Pixel local_3c;
  
  gamefield->width = 0x4b0;
  gamefield->height = 0x438;
  pPVar2 = (Pixel *)malloc(0x18b8200);
  gamefield->pixels = pPVar2;
  gamefield->simulationStep = '\0';
  (*glad_glGenTextures)(1,&gamefield->rendererId);
  (*glad_glBindTexture)(0xde1,gamefield->rendererId);
  (*glad_glTexParameteri)(0xde1,0x2801,0x2601);
  (*glad_glTexParameteri)(0xde1,0x2800,0x2601);
  (*glad_glTexParameteri)(0xde1,0x2802,0x812d);
  (*glad_glTexParameteri)(0xde1,0x2803,0x812d);
  if (gamefield->width * gamefield->height != 0) {
    lVar3 = 0;
    uVar4 = 0;
    do {
      GetEmpty(&local_3c);
      pPVar2 = gamefield->pixels;
      *(undefined4 *)(&pPVar2->flameable + lVar3) = local_3c._16_4_;
      puVar1 = &(pPVar2->color).r + lVar3;
      *(undefined8 *)puVar1 = local_3c._0_8_;
      *(undefined8 *)(puVar1 + 8) = local_3c._8_8_;
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x14;
    } while (uVar4 < gamefield->width * gamefield->height);
  }
  OnUpdateGamefield(gamefield);
  (*glad_glBindTexture)(0xde1,0);
  return;
}

Assistant:

void InitGamefield(Gamefield* gamefield) {
    gamefield->width = WIDTH;
    gamefield->height = HEIGHT;
    gamefield->pixels = malloc(sizeof(Pixel) * gamefield->width * gamefield->height);
    gamefield->simulationStep = 0;

    glGenTextures(1, &gamefield->rendererId);
    glBindTexture(GL_TEXTURE_2D, gamefield->rendererId);

    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_BORDER);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_BORDER);

    for (size_t i = 0; i < gamefield->height * gamefield->width; i++) {
        Pixel pixel;
        GetEmpty(&pixel);
        gamefield->pixels[i] = pixel;
    }

    OnUpdateGamefield(gamefield);
    UnBindGamefield(gamefield);
}